

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_width<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                 *handler)

{
  int iVar1;
  char *begin_00;
  char *local_28;
  width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
  local_20;
  
  local_28 = begin;
  if (begin != end) {
    if ((byte)(*begin - 0x30U) < 10) {
      iVar1 = parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                        (&local_28,end,handler);
      ((handler->
       super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
       ).super_specs_setter<char>.specs_)->width = iVar1;
      begin_00 = local_28;
    }
    else {
      begin_00 = begin;
      if (*begin == '{') {
        begin_00 = begin + 1;
        if (begin_00 != end) {
          local_20.handler = handler;
          begin_00 = parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>>
                               (begin_00,end,&local_20);
        }
        if ((begin_00 == end) || (*begin_00 != '}')) {
          specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     ,"invalid format string");
        }
        else {
          begin_00 = begin_00 + 1;
        }
      }
    }
    return begin_00;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
              ,0xb18,"");
}

Assistant:

FMT_CONSTEXPR const Char* parse_width(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}